

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O2

upb_FieldDef ** upb_DefPool_GetAllExtensions(upb_DefPool *s,upb_MessageDef *m,size_t *count)

{
  upb_value uVar1;
  _Bool _Var2;
  upb_MessageDef *puVar3;
  size_t sVar4;
  upb_value val;
  intptr_t iter;
  uintptr_t key;
  upb_value local_60;
  long local_58;
  upb_FieldDef **local_50;
  intptr_t local_48;
  size_t *local_40;
  uintptr_t local_38;
  
  local_48 = -1;
  sVar4 = 0;
  local_40 = count;
  while( true ) {
    _Var2 = upb_inttable_next(&s->exts,&local_38,&local_60,&local_48);
    if (!_Var2) break;
    puVar3 = upb_FieldDef_ContainingType((upb_FieldDef *)local_60.val);
    sVar4 = sVar4 + (puVar3 == m);
  }
  local_58 = 0;
  local_50 = (upb_FieldDef **)(*upb_alloc_global.func)(&upb_alloc_global,(void *)0x0,0,sVar4 * 8);
  local_48 = -1;
  while( true ) {
    _Var2 = upb_inttable_next(&s->exts,&local_38,&local_60,&local_48);
    uVar1.val = local_60.val;
    if (!_Var2) break;
    puVar3 = upb_FieldDef_ContainingType((upb_FieldDef *)local_60.val);
    if (puVar3 == m) {
      local_50[local_58] = (upb_FieldDef *)uVar1.val;
      local_58 = local_58 + 1;
    }
  }
  *local_40 = sVar4;
  return local_50;
}

Assistant:

const upb_FieldDef** upb_DefPool_GetAllExtensions(const upb_DefPool* s,
                                                  const upb_MessageDef* m,
                                                  size_t* count) {
  size_t n = 0;
  intptr_t iter = UPB_INTTABLE_BEGIN;
  uintptr_t key;
  upb_value val;
  // This is O(all exts) instead of O(exts for m).  If we need this to be
  // efficient we may need to make extreg into a two-level table, or have a
  // second per-message index.
  while (upb_inttable_next(&s->exts, &key, &val, &iter)) {
    const upb_FieldDef* f = upb_value_getconstptr(val);
    if (upb_FieldDef_ContainingType(f) == m) n++;
  }
  const upb_FieldDef** exts = upb_gmalloc(n * sizeof(*exts));
  iter = UPB_INTTABLE_BEGIN;
  size_t i = 0;
  while (upb_inttable_next(&s->exts, &key, &val, &iter)) {
    const upb_FieldDef* f = upb_value_getconstptr(val);
    if (upb_FieldDef_ContainingType(f) == m) exts[i++] = f;
  }
  *count = n;
  return exts;
}